

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::ControlFlowWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan
               (Fixer *self,Expression **currp)

{
  Expression *pEVar1;
  Block *pBVar2;
  SIMDExtract *pSVar3;
  SIMDLoad *pSVar4;
  GlobalSet *pGVar5;
  AtomicCmpxchg *pAVar6;
  Return *pRVar7;
  MemoryCopy *pMVar8;
  AtomicNotify *pAVar9;
  TupleMake *pTVar10;
  Load *pLVar11;
  CallRef *pCVar12;
  Call *pCVar13;
  StructNew *pSVar14;
  ArrayNew *pAVar15;
  ArrayNewFixed *pAVar16;
  Expression **ppEVar17;
  Break *pBVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Try *pTVar21;
  Store *pSVar22;
  Throw *pTVar23;
  TupleExtract *pTVar24;
  StringNew *pSVar25;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **currp_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_01;
  Expression **currp_02;
  Expression **currp_03;
  Name *currp_04;
  Expression **currp_05;
  Expression **currp_06;
  Expression **currp_07;
  ulong uVar26;
  Expression *this;
  ArrayInit *pAVar27;
  
  pEVar1 = *currp;
  uVar26 = (ulong)pEVar1->_id;
  this = pEVar1;
  if ((uVar26 < 0x32) && ((0x200000000000eU >> (uVar26 & 0x3f) & 1) != 0)) {
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               doPostVisitControlFlow,currp);
    this = *currp;
    uVar26 = (ulong)this->_id;
  }
  switch(uVar26) {
  case 0:
  case 0x56:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
               ,0xb0);
  case 1:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBlock,currp);
    pBVar2 = Expression::cast<wasm::Block>(this);
    uVar26 = (ulong)(uint)(pBVar2->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar2->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 2:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitIf,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pMVar8->size,currp_02);
    goto LAB_0015f931;
  case 3:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLoop,currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_0015f4a5;
  case 4:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBreak,currp);
    pBVar18 = Expression::cast<wasm::Break>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pBVar18->condition,currp_00);
    ppEVar17 = &pBVar18->value;
    currp_01 = extraout_RDX_01;
    goto LAB_0015f481;
  case 5:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSwitch,currp);
    pSVar19 = Expression::cast<wasm::Switch>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pSVar19->condition);
    ppEVar17 = &pSVar19->value;
    currp_01 = extraout_RDX_02;
    goto LAB_0015f481;
  case 6:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitCall,currp);
    pCVar13 = Expression::cast<wasm::Call>(this);
    uVar26 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 7:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitCallIndirect,
               currp);
    pCVar20 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pCVar20->target);
    uVar26 = (ulong)(uint)(pCVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar20->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 8:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    break;
  case 9:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLocalSet,currp);
    pSVar3 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_0015f7ca;
  case 10:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    break;
  case 0xb:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitGlobalSet,currp);
    pGVar5 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_0015f4a5;
  case 0xc:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLoad,currp);
    pLVar11 = Expression::cast<wasm::Load>(this);
    pAVar27 = (ArrayInit *)&pLVar11->ptr;
    goto LAB_0015f9c8;
  case 0xd:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_0015f78e;
  case 0xe:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    break;
  case 0xf:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitUnary,currp);
    pSVar3 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_0015f7ca;
  case 0x10:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBinary,currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::Binary>(this);
    goto LAB_0015f9a2;
  case 0x11:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSelect,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_0015f508;
  case 0x12:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitDrop,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::Drop>(this);
    goto LAB_0015f978;
  case 0x13:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitReturn,currp);
    pRVar7 = Expression::cast<wasm::Return>(this);
    ppEVar17 = &pRVar7->value;
    currp_01 = extraout_RDX;
    goto LAB_0015f481;
  case 0x14:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemorySize,currp)
    ;
    Expression::cast<wasm::MemorySize>(this);
    break;
  case 0x15:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryGrow,currp)
    ;
    pTVar24 = (TupleExtract *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_0015f978;
  case 0x16:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    break;
  case 0x17:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitUnreachable,currp
              );
    Expression::cast<wasm::Unreachable>(this);
    break;
  case 0x18:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicRMW,currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_0015f848;
  case 0x19:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicCmpxchg,
               currp);
    pAVar6 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_0015f82b;
  case 0x1a:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicWait,currp)
    ;
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_0015f1cb;
  case 0x1b:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar9 = Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_0015f9a2;
  case 0x1c:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicFence,currp
              );
    Expression::cast<wasm::AtomicFence>(this);
    break;
  case 0x1d:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDExtract,currp
              );
    pSVar3 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_0015f7ca;
  case 0x1e:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDReplace,currp
              );
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::SIMDReplace>(this);
    currp_04 = &pAVar9->memory;
    goto LAB_0015f9b0;
  case 0x1f:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDShuffle,currp
              );
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0015f931;
  case 0x20:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDTernary,currp
              );
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_0015f1cb;
  case 0x21:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDShift,currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_0015f9a2;
  case 0x22:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDLoad,currp);
    pSVar4 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0015f665;
  case 0x23:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDLoadStoreLane
               ,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_0015f78e:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pSVar22->value);
    pAVar27 = (ArrayInit *)&pSVar22->ptr;
    goto LAB_0015f9c8;
  case 0x24:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryInit,currp)
    ;
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_0015f82b:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)&pAVar6->replacement);
    goto LAB_0015f848;
  case 0x25:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    break;
  case 0x26:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryCopy,currp)
    ;
    pMVar8 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_0015f508;
  case 0x27:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryFill,currp)
    ;
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_0015f508;
  case 0x28:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    break;
  case 0x29:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    break;
  case 0x2a:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefIsNull,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_0015f978;
  case 0x2b:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    break;
  case 0x2c:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefEq,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0015f931;
  case 0x2d:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableGet,currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_0015f4a5:
    pAVar27 = (ArrayInit *)&pGVar5->value;
    goto LAB_0015f9c8;
  case 0x2e:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableSet,currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_0015f848;
  case 0x2f:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    break;
  case 0x30:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableGrow,currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_0015f848:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pAVar6->expected);
    pAVar27 = (ArrayInit *)&pAVar6->ptr;
    goto LAB_0015f9c8;
  case 0x31:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTry,currp);
    pTVar21 = Expression::cast<wasm::Try>(this);
    uVar26 = (ulong)*(uint *)(pTVar21 + 0x50);
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar21 + 0x48),uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    pAVar27 = (ArrayInit *)(pTVar21 + 0x20);
    goto LAB_0015f9c8;
  case 0x32:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar26 = (ulong)*(uint *)(pTVar23 + 0x28);
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar23 + 0x20),uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 0x33:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    break;
  case 0x34:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTupleMake,currp);
    pTVar10 = Expression::cast<wasm::TupleMake>(this);
    uVar26 = (ulong)(uint)(pTVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar10->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 0x35:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTupleExtract,
               currp);
    pTVar24 = Expression::cast<wasm::TupleExtract>(this);
    goto LAB_0015f978;
  case 0x36:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitI31New,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::I31New>(this);
    goto LAB_0015f978;
  case 0x37:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitI31Get,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::I31Get>(this);
    goto LAB_0015f978;
  case 0x38:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitCallRef,currp);
    pCVar12 = Expression::cast<wasm::CallRef>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pCVar12->target);
    uVar26 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 0x39:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefTest,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::RefTest>(this);
    goto LAB_0015f978;
  case 0x3a:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefCast,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::RefCast>(this);
    goto LAB_0015f978;
  case 0x3b:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBrOn,currp);
    pSVar4 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_0015f665:
    pAVar27 = (ArrayInit *)&pSVar4->ptr;
    goto LAB_0015f9c8;
  case 0x3c:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructNew,currp);
    pSVar14 = Expression::cast<wasm::StructNew>(this);
    uVar26 = (ulong)(uint)(pSVar14->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 0x3d:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructGet,currp);
    pSVar3 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_0015f7ca;
  case 0x3e:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructSet,currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::StructSet>(this);
    goto LAB_0015f9a2;
  case 0x3f:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNew,currp);
    pAVar15 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pAVar15->size);
    ppEVar17 = &pAVar15->init;
    currp_01 = extraout_RDX_00;
LAB_0015f481:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)ppEVar17,currp_01);
    break;
  case 0x40:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNewSeg,currp
              );
    pAVar27 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_0015f366;
  case 0x41:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNewFixed,
               currp);
    pAVar16 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar26 = (ulong)(uint)(pAVar16->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar16->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,ppEVar17);
    }
    break;
  case 0x42:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayGet,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0015f931;
  case 0x43:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArraySet,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_0015f508;
  case 0x44:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayLen,currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_0015f978;
  case 0x45:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayCopy,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)&(pMVar8->destMemory).super_IString.str._M_str);
    goto LAB_0015f17e;
  case 0x46:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayFill,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_0015f17e:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)&pMVar8->destMemory);
    goto LAB_0015f508;
  case 0x47:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayInit,currp);
    pAVar27 = Expression::cast<wasm::ArrayInit>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)(pAVar27 + 0x40));
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)(pAVar27 + 0x38));
LAB_0015f366:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)(pAVar27 + 0x30));
    pAVar27 = pAVar27 + 0x28;
    goto LAB_0015f9c8;
  case 0x48:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefAs,currp);
    pSVar3 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_0015f7ca;
  case 0x49:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringNew,currp);
    pSVar25 = Expression::cast<wasm::StringNew>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)(pSVar25 + 0x30),currp_05);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)(pSVar25 + 0x28),currp_06);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)(pSVar25 + 0x20),currp_07);
    pAVar27 = (ArrayInit *)(pSVar25 + 0x18);
    goto LAB_0015f9c8;
  case 0x4a:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringConst,currp
              );
    Expression::cast<wasm::StringConst>(this);
    break;
  case 0x4b:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringMeasure,
               currp);
    pSVar3 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_0015f7ca;
  case 0x4c:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringEncode,
               currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::StringEncode>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pAVar9->memory,currp_03);
    currp_04 = (Name *)&pAVar9->notifyCount;
    goto LAB_0015f9b0;
  case 0x4d:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringConcat,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0015f931;
  case 0x4e:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringEq,currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::StringEq>(this);
    goto LAB_0015f9a2;
  case 0x4f:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringAs,currp);
    pSVar3 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_0015f7ca:
    pAVar27 = (ArrayInit *)&pSVar3->vec;
    goto LAB_0015f9c8;
  case 0x50:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringWTF8Advance
               ,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_0015f508:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pMVar8->size);
    goto LAB_0015f931;
  case 0x51:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringWTF16Get,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0015f931;
  case 0x52:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringIterNext,
               currp);
    pTVar24 = (TupleExtract *)Expression::cast<wasm::StringIterNext>(this);
LAB_0015f978:
    pAVar27 = (ArrayInit *)&pTVar24->tuple;
    goto LAB_0015f9c8;
  case 0x53:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringIterMove,
               currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::StringIterMove>(this);
LAB_0015f9a2:
    currp_04 = (Name *)&pAVar9->notifyCount;
LAB_0015f9b0:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)currp_04);
    pAVar27 = (ArrayInit *)&pAVar9->ptr;
    goto LAB_0015f9c8;
  case 0x54:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringSliceWTF,
               currp);
    pAVar9 = (AtomicNotify *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_0015f1cb:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)&pAVar9->memory);
    currp_04 = (Name *)&pAVar9->notifyCount;
    goto LAB_0015f9b0;
  case 0x55:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringSliceIter,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_0015f931:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               &pMVar8->source);
    pAVar27 = (ArrayInit *)&pMVar8->dest;
LAB_0015f9c8:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,scan,
               (Expression **)pAVar27);
  }
  if (((ulong)pEVar1->_id < 0x32) && ((0x200000000000eU >> ((ulong)pEVar1->_id & 0x3f) & 1) != 0)) {
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               doPreVisitControlFlow,currp);
    return;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPostVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPreVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }
  }